

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  uint *puVar1;
  CommentInfo *pCVar2;
  ptrdiff_t pVar3;
  byte bVar4;
  ushort uVar5;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  char *pcVar6;
  undefined8 *puVar7;
  size_t len;
  long lVar8;
  
  bVar4 = (byte)*(ushort *)&other->field_0x8;
  uVar5 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | *(ushort *)&other->field_0x8 & 0xff;
  *(ushort *)&this->field_0x8 = uVar5;
  this->comments_ = (CommentInfo *)0x0;
  pVar3 = other->limit_;
  this->start_ = other->start_;
  this->limit_ = pVar3;
  if (bVar4 < 8) {
    if ((0x2fU >> (bVar4 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (bVar4 & 0x1f) & 1) == 0) {
        puVar1 = (uint *)(other->value_).string_;
        if ((puVar1 == (uint *)0x0) || ((other->field_0x9 & 1) == 0)) {
          (this->value_).string_ = (char *)puVar1;
          *(ushort *)&this->field_0x8 = uVar5;
        }
        else {
          pcVar6 = duplicateAndPrefixStringValue((char *)(puVar1 + 1),*puVar1);
          (this->value_).string_ = pcVar6;
          this->field_0x9 = this->field_0x9 | 1;
        }
      }
      else {
        this_00 = (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   *)operator_new(0x30);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_Rb_tree(this_00,&((other->value_).map_)->_M_t);
        (this->value_).map_ = (ObjectValues *)this_00;
      }
    }
    else {
      this->value_ = other->value_;
    }
    if (other->comments_ != (CommentInfo *)0x0) {
      puVar7 = (undefined8 *)operator_new__(0x20);
      *puVar7 = 3;
      puVar7[1] = 0;
      puVar7[2] = 0;
      puVar7[3] = 0;
      this->comments_ = (CommentInfo *)(puVar7 + 1);
      lVar8 = 0;
      do {
        pcVar6 = *(char **)((long)&other->comments_->comment_ + lVar8);
        if (pcVar6 != (char *)0x0) {
          pCVar2 = this->comments_;
          len = strlen(pcVar6);
          CommentInfo::setComment((CommentInfo *)((long)&pCVar2->comment_ + lVar8),pcVar6,len);
        }
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x18);
    }
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                ,0x1db,"Json::Value::Value(const Value &)");
}

Assistant:

Value::Value(Value const& other)
    : type_(other.type_), allocated_(false)
      ,
      comments_(0), start_(other.start_), limit_(other.limit_)
{
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    value_ = other.value_;
    break;
  case stringValue:
    if (other.value_.string_ && other.allocated_) {
      unsigned len;
      char const* str;
      decodePrefixedString(other.allocated_, other.value_.string_,
          &len, &str);
      value_.string_ = duplicateAndPrefixStringValue(str, len);
      allocated_ = true;
    } else {
      value_.string_ = other.value_.string_;
      allocated_ = false;
    }
    break;
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues(*other.value_.map_);
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  if (other.comments_) {
    comments_ = new CommentInfo[numberOfCommentPlacement];
    for (int comment = 0; comment < numberOfCommentPlacement; ++comment) {
      const CommentInfo& otherComment = other.comments_[comment];
      if (otherComment.comment_)
        comments_[comment].setComment(
            otherComment.comment_, strlen(otherComment.comment_));
    }
  }
}